

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcat_s.c
# Opt level: O0

errno_t strcat_s(char *dest,rsize_t dmax,char *src)

{
  long lVar1;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  char *overlap_bumper;
  char *orig_dest;
  rsize_t orig_dmax;
  undefined4 in_stack_ffffffffffffffb8;
  errno_t in_stack_ffffffffffffffbc;
  void *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  char *local_28;
  ulong local_20;
  char *local_18;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (char *)0x0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    local_c = 400;
  }
  else if (in_RDX == (char *)0x0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    local_c = 400;
  }
  else if (in_RSI == 0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    local_c = 0x191;
  }
  else if (in_RSI < 0x10000001) {
    local_20 = in_RSI;
    local_18 = in_RDI;
    local_28 = in_RDX;
    if (in_RDI < in_RDX) {
      do {
        if (*local_18 == '\0') goto LAB_001085c2;
        if (local_18 == in_RDX) {
          handle_error(in_RDI,(rsize_t)in_RDX,
                       (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
          local_c = 0x194;
          goto LAB_0010877b;
        }
        local_18 = local_18 + 1;
        local_20 = local_20 - 1;
      } while (local_20 != 0);
      handle_error(in_RDI,(rsize_t)in_RDX,
                   (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      local_c = 0x197;
    }
    else {
      do {
        if (*local_18 == '\0') goto LAB_001086c5;
        local_18 = local_18 + 1;
        local_20 = local_20 - 1;
      } while (local_20 != 0);
      handle_error(in_RDI,(rsize_t)in_RDI,
                   (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      local_c = 0x197;
    }
  }
  else {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    local_c = 0x193;
  }
LAB_0010877b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
LAB_001086c5:
  in_RDX = in_RDI;
  if (local_20 == 0) goto LAB_00108758;
  if (local_28 == in_RDI) {
    handle_error(in_RDI,(rsize_t)in_RDI,
                 (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    local_c = 0x194;
    goto LAB_0010877b;
  }
  *local_18 = *local_28;
  if (*local_18 == '\0') {
    local_c = 0;
    goto LAB_0010877b;
  }
  local_20 = local_20 - 1;
  local_18 = local_18 + 1;
  local_28 = local_28 + 1;
  goto LAB_001086c5;
LAB_001085c2:
  if (local_20 == 0) goto LAB_00108758;
  if (local_18 == in_RDX) {
    handle_error(in_RDI,(rsize_t)in_RDX,
                 (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    local_c = 0x194;
    goto LAB_0010877b;
  }
  *local_18 = *local_28;
  if (*local_18 == '\0') {
    local_c = 0;
    goto LAB_0010877b;
  }
  local_20 = local_20 - 1;
  local_18 = local_18 + 1;
  local_28 = local_28 + 1;
  goto LAB_001085c2;
LAB_00108758:
  handle_error(in_RDI,(rsize_t)in_RDX,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  local_c = 0x196;
  goto LAB_0010877b;
}

Assistant:

errno_t
strcat_s (char *dest, rsize_t dmax, const char *src)
{
    rsize_t orig_dmax;
    char *orig_dest;
    const char *overlap_bumper;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcat_s: dest is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strcat_s: src is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcat_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcat_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    /* hold base of dest in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (dest < src) {
        overlap_bumper = src;

        /* Find the end of dest */
        while (*dest != '\0') {

            if (dest == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strcat_s: "
                             "overlapping objects",
                             ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

            dest++;
            dmax--;
            if (dmax == 0) {
                handle_error(orig_dest, orig_dmax, "strcat_s: "
                             "dest unterminated",
                             ESUNTERM);
                return RCNEGATE(ESUNTERM);
            }
        }

        while (dmax > 0) {
            if (dest == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strcat_s: "
                             "overlapping objects",
                             ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

            *dest = *src;
            if (*dest == '\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack to clear any data */
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#endif
                return RCNEGATE(EOK);
            }

            dmax--;
            dest++;
            src++;
        }

    } else {
        overlap_bumper = dest;

        /* Find the end of dest */
        while (*dest != '\0') {

            /*
             * NOTE: no need to check for overlap here since src comes first
             * in memory and we're not incrementing src here.
             */
            dest++;
            dmax--;
            if (dmax == 0) {
                handle_error(orig_dest, orig_dmax, "strcat_s: "
                             "dest unterminated",
                             ESUNTERM);
                return RCNEGATE(ESUNTERM);
            }
        }

        while (dmax > 0) {
            if (src == overlap_bumper) {
                handle_error(orig_dest, orig_dmax, "strcat_s: "
                             "overlapping objects",
                             ESOVRLP);
                return RCNEGATE(ESOVRLP);
            }

            *dest = *src;
            if (*dest == '\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack to clear any data */
                while (dmax) { *dest = '\0'; dmax--; dest++; }
#endif
                return RCNEGATE(EOK);
            }

            dmax--;
            dest++;
            src++;
        }
    }

    /*
     * the entire src was not copied, so null the string
     */
    handle_error(orig_dest, orig_dmax, "strcat_s: not enough "
                      "space for src",
                      ESNOSPC);

    return RCNEGATE(ESNOSPC);
}